

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O0

void check_header(gz_stream *s)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  size_t sVar5;
  bool bVar6;
  uint local_1c;
  int c;
  uInt len;
  int flags;
  int method;
  gz_stream *s_local;
  
  uVar2 = (s->stream).avail_in;
  if (uVar2 < 2) {
    if (uVar2 != 0) {
      *s->inbuf = *(s->stream).next_in;
    }
    piVar4 = __errno_location();
    *piVar4 = 0;
    sVar5 = fread(s->inbuf + uVar2,1,(long)(0x4000 >> ((byte)uVar2 & 0x1f)),(FILE *)s->file);
    if (((int)sVar5 == 0) && (iVar1 = ferror((FILE *)s->file), iVar1 != 0)) {
      s->z_err = -1;
    }
    (s->stream).avail_in = (int)sVar5 + (s->stream).avail_in;
    (s->stream).next_in = s->inbuf;
    if ((s->stream).avail_in < 2) {
      s->transparent = (s->stream).avail_in;
      return;
    }
  }
  if ((*(s->stream).next_in == '\x1f') && ((s->stream).next_in[1] == 0x8b)) {
    (s->stream).avail_in = (s->stream).avail_in - 2;
    (s->stream).next_in = (s->stream).next_in + 2;
    iVar1 = get_byte(s);
    uVar2 = get_byte(s);
    if ((iVar1 == 8) && ((uVar2 & 0xe0) == 0)) {
      for (local_1c = 0; local_1c < 6; local_1c = local_1c + 1) {
        get_byte(s);
      }
      if ((uVar2 & 4) != 0) {
        iVar1 = get_byte(s);
        iVar3 = get_byte(s);
        local_1c = iVar3 * 0x100 + iVar1;
        do {
          bVar6 = false;
          if (local_1c != 0) {
            iVar1 = get_byte(s);
            bVar6 = iVar1 != -1;
          }
          local_1c = local_1c + -1;
        } while (bVar6);
      }
      if ((uVar2 & 8) != 0) {
        do {
          iVar1 = get_byte(s);
        } while (iVar1 != 0 && iVar1 != -1);
      }
      if ((uVar2 & 0x10) != 0) {
        do {
          iVar1 = get_byte(s);
        } while (iVar1 != 0 && iVar1 != -1);
      }
      if ((uVar2 & 2) != 0) {
        for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
          get_byte(s);
        }
      }
      iVar1 = 0;
      if (s->z_eof != 0) {
        iVar1 = -3;
      }
      s->z_err = iVar1;
    }
    else {
      s->z_err = -3;
    }
  }
  else {
    s->transparent = 1;
  }
  return;
}

Assistant:

local void check_header(s)
    gz_stream *s;
{
    int method; /* method byte */
    int flags;  /* flags byte */
    uInt len;
    int c;

    /* Assure two bytes in the buffer so we can peek ahead -- handle case
       where first byte of header is at the end of the buffer after the last
       gzip segment */
    len = s->stream.avail_in;
    if (len < 2) {
        if (len) s->inbuf[0] = s->stream.next_in[0];
        errno = 0;
        len = (uInt)fread(s->inbuf + len, 1, Z_BUFSIZE >> len, s->file);
        if (len == 0 && ferror(s->file)) s->z_err = Z_ERRNO;
        s->stream.avail_in += len;
        s->stream.next_in = s->inbuf;
        if (s->stream.avail_in < 2) {
            s->transparent = s->stream.avail_in;
            return;
        }
    }

    /* Peek ahead to check the gzip magic header */
    if (s->stream.next_in[0] != gz_magic[0] ||
        s->stream.next_in[1] != gz_magic[1]) {
        s->transparent = 1;
        return;
    }
    s->stream.avail_in -= 2;
    s->stream.next_in += 2;

    /* Check the rest of the gzip header */
    method = get_byte(s);
    flags = get_byte(s);
    if (method != Z_DEFLATED || (flags & RESERVED) != 0) {
        s->z_err = Z_DATA_ERROR;
        return;
    }

    /* Discard time, xflags and OS code: */
    for (len = 0; len < 6; len++) (void)get_byte(s);

    if ((flags & EXTRA_FIELD) != 0) { /* skip the extra field */
        len  =  (uInt)get_byte(s);
        len += ((uInt)get_byte(s))<<8;
        /* len is garbage if EOF but the loop below will quit anyway */
        while (len-- != 0 && get_byte(s) != EOF) ;
    }
    if ((flags & ORIG_NAME) != 0) { /* skip the original file name */
        while ((c = get_byte(s)) != 0 && c != EOF) ;
    }
    if ((flags & COMMENT) != 0) {   /* skip the .gz file comment */
        while ((c = get_byte(s)) != 0 && c != EOF) ;
    }
    if ((flags & HEAD_CRC) != 0) {  /* skip the header crc */
        for (len = 0; len < 2; len++) (void)get_byte(s);
    }
    s->z_err = s->z_eof ? Z_DATA_ERROR : Z_OK;
}